

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdPlugin.c
# Opt level: O3

int Cmd_CommandAbcLoadPlugIn(Abc_Frame_t *pAbc,int argc,char **argv)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  bool bVar3;
  bool bVar4;
  Abc_Frame_t *pAVar5;
  int iVar6;
  FILE *pFVar7;
  Vec_Str_t *pVVar8;
  char *pcVar9;
  size_t sVar10;
  void **ppvVar11;
  char *pcVar12;
  char *pcVar13;
  char pBuffer [1000];
  char *local_440;
  Vec_Str_t *local_438;
  char *local_430;
  Abc_Frame_t *local_428;
  undefined8 local_420;
  char local_418 [1000];
  
  local_440 = (char *)0x0;
  bVar4 = false;
  local_428 = pAbc;
  Extra_UtilGetoptReset();
  bVar3 = false;
  while( true ) {
    while (iVar6 = Extra_UtilGetopt(argc,argv,"vph"), iVar6 == 0x70) {
      bVar3 = (bool)(bVar3 ^ 1);
    }
    if (iVar6 == -1) break;
    if (iVar6 != 0x76) goto LAB_00886cf1;
    bVar4 = (bool)(bVar4 ^ 1);
  }
  if (globalUtilOptind + 2 == argc) {
    pcVar12 = argv[(long)argc + -2];
    local_420 = argv[(long)argc + -1];
    if (!bVar3) {
      pFVar7 = fopen(pcVar12,"r");
      if (pFVar7 == (FILE *)0x0) {
        iVar6 = -1;
        Abc_Print(-1,"Cannot run the binary \"%s\". File does not exist.\n",pcVar12);
        pVVar8 = (Vec_Str_t *)0x0;
        goto LAB_0088704b;
      }
      fclose(pFVar7);
    }
    pcVar13 = ".txt";
    iVar6 = Util_SignalTmpFile("__abctmp_",".txt",&local_440);
    if (iVar6 == -1) {
      iVar6 = -1;
      Abc_Print(-1,"Cannot create a temporary file.\n");
      pVVar8 = (Vec_Str_t *)0x0;
    }
    else {
      close(iVar6);
      pVVar8 = (Vec_Str_t *)malloc(0x10);
      pVVar8->nCap = 1000;
      pVVar8->nSize = 0;
      pcVar9 = (char *)malloc(1000);
      pVVar8->pArray = pcVar9;
      local_430 = pcVar12;
      Vec_StrPrintF(pVVar8,pcVar13,pcVar12,local_440);
      uVar1 = pVVar8->nSize;
      if (uVar1 == pVVar8->nCap) {
        if ((int)uVar1 < 0x10) {
          if (pVVar8->pArray == (char *)0x0) {
            pcVar12 = (char *)malloc(0x10);
          }
          else {
            pcVar12 = (char *)realloc(pVVar8->pArray,0x10);
          }
          pVVar8->pArray = pcVar12;
          pVVar8->nCap = 0x10;
        }
        else {
          sVar10 = (ulong)uVar1 * 2;
          if (pVVar8->pArray == (char *)0x0) {
            pcVar12 = (char *)malloc(sVar10);
          }
          else {
            pcVar12 = (char *)realloc(pVVar8->pArray,sVar10);
          }
          pVVar8->pArray = pcVar12;
          pVVar8->nCap = (int)sVar10;
        }
      }
      else {
        pcVar12 = pVVar8->pArray;
      }
      pVVar8->nSize = uVar1 + 1;
      pcVar12[(int)uVar1] = '\0';
      pcVar12 = pVVar8->pArray;
      local_438 = pVVar8;
      if (bVar4) {
        Abc_Print(2,"Running command %s\n",pcVar12);
      }
      iVar6 = Util_SignalSystem(pcVar12);
      if (iVar6 == 0) {
        pFVar7 = fopen(local_440,"r");
        if (pFVar7 == (FILE *)0x0) {
          iVar6 = -1;
          Abc_Print(-1,"Cannot open file with the list of commands.\n");
          pVVar8 = local_438;
        }
        else {
          while (pcVar12 = fgets(local_418,1000,pFVar7), pcVar12 != (char *)0x0) {
            sVar10 = strlen(local_418);
            pAVar5 = local_428;
            if (local_418[sVar10 - 1] == '\n') {
              local_418[sVar10 - 1] = '\0';
            }
            Cmd_CommandAdd(local_428,local_420,local_418,Cmd_CommandAbcPlugIn,1);
            pVVar2 = pAVar5->vPlugInComBinPairs;
            pcVar12 = Extra_UtilStrsav(local_418);
            uVar1 = pVVar2->nSize;
            if (uVar1 == pVVar2->nCap) {
              if ((int)uVar1 < 0x10) {
                if (pVVar2->pArray == (void **)0x0) {
                  ppvVar11 = (void **)malloc(0x80);
                }
                else {
                  ppvVar11 = (void **)realloc(pVVar2->pArray,0x80);
                }
                pVVar2->pArray = ppvVar11;
                pVVar2->nCap = 0x10;
              }
              else {
                if (pVVar2->pArray == (void **)0x0) {
                  ppvVar11 = (void **)malloc((ulong)uVar1 << 4);
                }
                else {
                  ppvVar11 = (void **)realloc(pVVar2->pArray,(ulong)uVar1 << 4);
                }
                pVVar2->pArray = ppvVar11;
                pVVar2->nCap = uVar1 * 2;
              }
            }
            else {
              ppvVar11 = pVVar2->pArray;
            }
            iVar6 = pVVar2->nSize;
            pVVar2->nSize = iVar6 + 1;
            ppvVar11[iVar6] = pcVar12;
            pVVar2 = local_428->vPlugInComBinPairs;
            pcVar12 = Extra_UtilStrsav(local_430);
            uVar1 = pVVar2->nSize;
            if (uVar1 == pVVar2->nCap) {
              if ((int)uVar1 < 0x10) {
                if (pVVar2->pArray == (void **)0x0) {
                  ppvVar11 = (void **)malloc(0x80);
                }
                else {
                  ppvVar11 = (void **)realloc(pVVar2->pArray,0x80);
                }
                pVVar2->pArray = ppvVar11;
                pVVar2->nCap = 0x10;
              }
              else {
                if (pVVar2->pArray == (void **)0x0) {
                  ppvVar11 = (void **)malloc((ulong)uVar1 << 4);
                }
                else {
                  ppvVar11 = (void **)realloc(pVVar2->pArray,(ulong)uVar1 << 4);
                }
                pVVar2->pArray = ppvVar11;
                pVVar2->nCap = uVar1 * 2;
              }
            }
            else {
              ppvVar11 = pVVar2->pArray;
            }
            iVar6 = pVVar2->nSize;
            pVVar2->nSize = iVar6 + 1;
            ppvVar11[iVar6] = pcVar12;
            if (bVar4) {
              Abc_Print(2,"Creating command %s with binary %s\n",local_418,local_430);
            }
          }
          fclose(pFVar7);
          iVar6 = 0;
          pVVar8 = local_438;
        }
      }
      else {
        Abc_Print(-1,"Command \"%s\" failed.\n",pcVar12);
        pVVar8 = local_438;
      }
    }
LAB_0088704b:
    if (local_440 != (char *)0x0) {
      Util_SignalTmpFileRemove(local_440,0);
    }
    if (pVVar8 != (Vec_Str_t *)0x0) {
      if (pVVar8->pArray != (char *)0x0) {
        free(pVVar8->pArray);
      }
      free(pVVar8);
    }
    if (local_440 != (char *)0x0) {
      free(local_440);
    }
  }
  else {
LAB_00886cf1:
    Abc_Print(-2,"usage: load_plugin [-pvh] <plugin_dir\\binary_name> <section_name>\n");
    Abc_Print(-2,"\t        loads external binary as a plugin\n");
    pcVar13 = "yes";
    pcVar12 = "yes";
    if (!bVar3) {
      pcVar12 = "no";
    }
    Abc_Print(-2,"\t-p    : toggle searching the command in PATH [default = %s].\n",pcVar12);
    if (!bVar4) {
      pcVar13 = "no";
    }
    Abc_Print(-2,"\t-v    : enable verbose output [default = %s].\n",pcVar13);
    Abc_Print(-2,"\t-h    : print the command usage\n");
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

int Cmd_CommandAbcLoadPlugIn( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int fPath, fVerbose;
    int fd = -1, RetValue = -1, c;
    FILE * pFile = NULL;
    char * pStrDirBin = NULL, * pStrSection = NULL;
    Vec_Str_t * sCommandLine = NULL;
    char * pTempFile = NULL;
    char pBuffer[1000];

    // set defaults
    fPath = 0;
    fVerbose = 0;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vph" ) ) != EOF )
    {
        switch ( c )
        {
        case 'p':
            fPath ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        default:
        goto usage;
    }
    }

    if ( argc != globalUtilOptind + 2 )
        goto usage;

    pStrDirBin  = argv[argc-2];
    pStrSection = argv[argc-1];

    // check if the file exists
    if ( !fPath )
    {
        FILE* pFile = fopen( pStrDirBin, "r" );

        if ( !pFile )
        {
            Abc_Print( ABC_ERROR, "Cannot run the binary \"%s\". File does not exist.\n", pStrDirBin );
            goto cleanup;
    }

    fclose( pFile );
    }

    // create temp file
    fd = Util_SignalTmpFile( "__abctmp_", ".txt", &pTempFile );

    if ( fd == -1 )
    {
        Abc_Print( ABC_ERROR, "Cannot create a temporary file.\n" );
        goto cleanup;
    }

#ifdef WIN32
    _close( fd );
#else
    close( fd );
#endif

    // get command list
    sCommandLine = Vec_StrAlloc(1000);

    Vec_StrPrintF(sCommandLine, "%s -abc -list-commands > %s", pStrDirBin, pTempFile );
    Vec_StrPush(sCommandLine, '\0');

    if(fVerbose)
    {
        Abc_Print(ABC_VERBOSE, "Running command %s\n", Vec_StrArray(sCommandLine));
    }

    RetValue = Util_SignalSystem( Vec_StrArray(sCommandLine) );

    if ( RetValue != 0 )
    {
        Abc_Print( ABC_ERROR, "Command \"%s\" failed.\n", Vec_StrArray(sCommandLine) );
        goto cleanup;
    }

    // create commands
    pFile = fopen( pTempFile, "r" );

    if ( pFile == NULL )
    {
        Abc_Print( -1, "Cannot open file with the list of commands.\n" );

        RetValue = -1;
        goto cleanup;
    }

    while ( fgets( pBuffer, 1000, pFile ) != NULL )
    {
        if ( pBuffer[strlen(pBuffer)-1] == '\n' )
            pBuffer[strlen(pBuffer)-1] = 0;

        Cmd_CommandAdd( pAbc, pStrSection, pBuffer, Cmd_CommandAbcPlugIn, 1 );

        Vec_PtrPush( pAbc->vPlugInComBinPairs, Extra_UtilStrsav(pBuffer) );
        Vec_PtrPush( pAbc->vPlugInComBinPairs, Extra_UtilStrsav(pStrDirBin) );

        if ( fVerbose )
        {
            Abc_Print(ABC_VERBOSE, "Creating command %s with binary %s\n", pBuffer, pStrDirBin);
    }
    }

cleanup:

    if( pFile )
    fclose( pFile );

    if( pTempFile )
    Util_SignalTmpFileRemove( pTempFile, 0 );

    Vec_StrFreeP(&sCommandLine);

    ABC_FREE( pTempFile );

    return RetValue;

usage:

    Abc_Print( -2, "usage: load_plugin [-pvh] <plugin_dir\\binary_name> <section_name>\n" );
    Abc_Print( -2, "\t        loads external binary as a plugin\n" );
    Abc_Print( -2, "\t-p    : toggle searching the command in PATH [default = %s].\n", fPath? "yes": "no" );
    Abc_Print( -2, "\t-v    : enable verbose output [default = %s].\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");

    return 1;
}